

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::ExportObjectCompileCommand
          (cmNinjaTargetGenerator *this,string *language,string *sourceFileName,string *objectDir,
          string *objectFileName,string *objectFileDir,string *flags,string *defines,
          string *includes,string *outputConfig)

{
  cmGeneratorTarget *pcVar1;
  cmMakefile *pcVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  cmGlobalNinjaGenerator *pcVar6;
  string *psVar7;
  undefined4 extraout_var;
  string *i;
  pointer s;
  cmOutputConverter *outputConverter;
  string_view arg;
  string_view source;
  string cudaCompileMode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  string cmdVar;
  string escapedSourceFileName;
  RuleVariables compileObjectVars;
  cmAlphaNum local_270;
  char *local_240;
  size_t local_238;
  char local_230 [16];
  string *local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  string local_200;
  undefined1 local_1e0 [48];
  string *local_1b0;
  string *local_1a8;
  string local_1a0;
  RuleVariables local_180;
  cmRulePlaceholderExpander *this_00;
  
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  local_1a8 = objectDir;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"EXPORT_COMPILE_COMMANDS",(allocator<char> *)&local_270);
  bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  if (bVar4) {
    memset(&local_180,0,0x150);
    local_180.Language = (language->_M_dataplus)._M_p;
    std::__cxx11::string::string((string *)&local_1a0,(string *)sourceFileName);
    bVar4 = cmsys::SystemTools::FileIsFullPath(sourceFileName);
    if (!bVar4) {
      pcVar6 = GetGlobalGenerator(this);
      psVar7 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((pcVar6->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      cmsys::SystemTools::CollapseFullPath((string *)&local_270,&local_1a0,psVar7);
      std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
    }
    source._M_str = local_1a0._M_dataplus._M_p;
    source._M_len = local_1a0._M_string_length;
    local_220 = objectFileName;
    local_1b0 = sourceFileName;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&local_270,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source,SHELL);
    std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    local_180.Source = local_1a0._M_dataplus._M_p;
    local_180.Object = (local_220->_M_dataplus)._M_p;
    local_180.ObjectDir = (local_1a8->_M_dataplus)._M_p;
    local_180.ObjectFileDir = (objectFileDir->_M_dataplus)._M_p;
    local_180.Flags = (flags->_M_dataplus)._M_p;
    local_180.Defines = (defines->_M_dataplus)._M_p;
    local_180.Includes = (includes->_M_dataplus)._M_p;
    local_240 = local_230;
    local_238 = 0;
    local_230[0] = '\0';
    bVar4 = std::operator==(language,"CUDA");
    if (bVar4) {
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"CUDA_SEPARABLE_COMPILATION",(allocator<char> *)local_1e0);
      bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      if (bVar4) {
        pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_270,"_CMAKE_CUDA_RDC_FLAG",(allocator<char> *)local_1e0);
        psVar7 = cmMakefile::GetRequiredDefinition(pcVar2,(string *)&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        local_270.View_._M_len = local_238;
        local_270.View_._M_str = local_240;
        local_1e0._8_8_ = (psVar7->_M_dataplus)._M_p;
        local_1e0._0_8_ = psVar7->_M_string_length;
        cmStrCat<char[2]>(&local_200,&local_270,(cmAlphaNum *)local_1e0,(char (*) [2])0x65e47a);
        std::__cxx11::string::operator=((string *)&local_240,(string *)&local_200);
        std::__cxx11::string::~string((string *)&local_200);
      }
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"CUDA_PTX_COMPILATION",(allocator<char> *)local_1e0);
      bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_270,"_CMAKE_CUDA_PTX_FLAG",(allocator<char> *)local_1e0);
        psVar7 = cmMakefile::GetRequiredDefinition(pcVar2,(string *)&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        local_270.View_._M_len = local_238;
        local_270.View_._M_str = local_240;
        local_1e0._8_8_ = (psVar7->_M_dataplus)._M_p;
        local_1e0._0_8_ = psVar7->_M_string_length;
        cmStrCat<>(&local_200,&local_270,(cmAlphaNum *)local_1e0);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_270,"_CMAKE_CUDA_WHOLE_FLAG",(allocator<char> *)local_1e0);
        psVar7 = cmMakefile::GetRequiredDefinition(pcVar2,(string *)&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        local_270.View_._M_len = local_238;
        local_270.View_._M_str = local_240;
        local_1e0._8_8_ = (psVar7->_M_dataplus)._M_p;
        local_1e0._0_8_ = psVar7->_M_string_length;
        cmStrCat<>(&local_200,&local_270,(cmAlphaNum *)local_1e0);
      }
      std::__cxx11::string::operator=((string *)&local_240,(string *)&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      local_180.CudaCompileMode = local_240;
    }
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_270.View_._M_len = (size_t)&DAT_00000006;
    local_270.View_._M_str = "CMAKE_";
    local_1e0._8_8_ = (language->_M_dataplus)._M_p;
    local_1e0._0_8_ = language->_M_string_length;
    cmStrCat<char[16]>(&local_200,&local_270,(cmAlphaNum *)local_1e0,
                       (char (*) [16])"_COMPILE_OBJECT");
    psVar7 = cmMakefile::GetRequiredDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,&local_200);
    arg._M_str = (psVar7->_M_dataplus)._M_p;
    arg._M_len = psVar7->_M_string_length;
    cmExpandList(arg,&local_218,false);
    iVar5 = (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              _vptr_cmLocalGenerator[5])();
    pbVar3 = local_218.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar5);
    for (s = local_218.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; s != pbVar3; s = s + 1) {
      outputConverter =
           &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
            super_cmOutputConverter;
      if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
        outputConverter = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables(this_00,outputConverter,s,&local_180);
    }
    local_1e0._0_8_ = local_1e0 + 0x10;
    local_1e0._8_8_ = (char *)0x0;
    local_1e0[0x10] = '\0';
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)&local_270,this->LocalGenerator,&local_218,outputConfig,outputConfig,
               (string *)local_1e0,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::~string((string *)local_1e0);
    pcVar6 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddCXXCompileCommand(pcVar6,(string *)&local_270,local_1b0,local_220);
    std::__cxx11::string::~string((string *)&local_270);
    if (this_00 != (cmRulePlaceholderExpander *)0x0) {
      (*(this_00->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])(this_00);
    }
    std::__cxx11::string::~string((string *)&local_200);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_218);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::ExportObjectCompileCommand(
  std::string const& language, std::string const& sourceFileName,
  std::string const& objectDir, std::string const& objectFileName,
  std::string const& objectFileDir, std::string const& flags,
  std::string const& defines, std::string const& includes,
  std::string const& outputConfig)
{
  if (!this->GeneratorTarget->GetPropertyAsBool("EXPORT_COMPILE_COMMANDS")) {
    return;
  }

  cmRulePlaceholderExpander::RuleVariables compileObjectVars;
  compileObjectVars.Language = language.c_str();

  std::string escapedSourceFileName = sourceFileName;

  if (!cmSystemTools::FileIsFullPath(sourceFileName)) {
    escapedSourceFileName =
      cmSystemTools::CollapseFullPath(escapedSourceFileName,
                                      this->GetGlobalGenerator()
                                        ->GetCMakeInstance()
                                        ->GetHomeOutputDirectory());
  }

  escapedSourceFileName = this->LocalGenerator->ConvertToOutputFormat(
    escapedSourceFileName, cmOutputConverter::SHELL);

  compileObjectVars.Source = escapedSourceFileName.c_str();
  compileObjectVars.Object = objectFileName.c_str();
  compileObjectVars.ObjectDir = objectDir.c_str();
  compileObjectVars.ObjectFileDir = objectFileDir.c_str();
  compileObjectVars.Flags = flags.c_str();
  compileObjectVars.Defines = defines.c_str();
  compileObjectVars.Includes = includes.c_str();

  // Rule for compiling object file.
  std::string cudaCompileMode;
  if (language == "CUDA") {
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      const std::string& rdcFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_RDC_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, rdcFlag, " ");
    }
    if (this->GeneratorTarget->GetPropertyAsBool("CUDA_PTX_COMPILATION")) {
      const std::string& ptxFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_PTX_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, ptxFlag);
    } else {
      const std::string& wholeFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_WHOLE_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, wholeFlag);
    }
    compileObjectVars.CudaCompileMode = cudaCompileMode.c_str();
  }

  std::vector<std::string> compileCmds;
  const std::string cmdVar = cmStrCat("CMAKE_", language, "_COMPILE_OBJECT");
  const std::string& compileCmd =
    this->Makefile->GetRequiredDefinition(cmdVar);
  cmExpandList(compileCmd, compileCmds);

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  for (std::string& i : compileCmds) {
    // no launcher for CMAKE_EXPORT_COMPILE_COMMANDS
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 compileObjectVars);
  }

  std::string cmdLine = this->GetLocalGenerator()->BuildCommandLine(
    compileCmds, outputConfig, outputConfig);

  this->GetGlobalGenerator()->AddCXXCompileCommand(cmdLine, sourceFileName,
                                                   objectFileName);
}